

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag25h9.c
# Opt level: O2

apriltag_family_t * tag25h9_create(void)

{
  apriltag_family_t *paVar1;
  char *pcVar2;
  uint64_t *puVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  
  paVar1 = (apriltag_family_t *)calloc(1,0x48);
  pcVar2 = strdup("tag25h9");
  paVar1->name = pcVar2;
  paVar1->h = 9;
  paVar1->ncodes = 0x23;
  puVar3 = (uint64_t *)calloc(0x23,8);
  paVar1->codes = puVar3;
  *puVar3 = 0x156f1f4;
  puVar3[1] = 0x1f28cd5;
  puVar3[2] = 0x16ce32c;
  puVar3[3] = 0x1ea379c;
  puVar3[4] = 0x1390f89;
  puVar3[5] = 0x34fad0;
  puVar3[6] = 0x7dcdb5;
  puVar3[7] = 0x119ba95;
  puVar3[8] = 0x1ae9daa;
  puVar3[9] = 0xdf02aa;
  puVar3[10] = 0x82fc15;
  puVar3[0xb] = 0x465123;
  puVar3[0xc] = 0xceee98;
  puVar3[0xd] = 0x1f17260;
  puVar3[0xe] = 0x14429cd;
  puVar3[0xf] = 0x17248a8;
  puVar3[0x10] = 0x16ad452;
  puVar3[0x11] = 0x9670ad;
  puVar3[0x12] = 0x16f65b2;
  puVar3[0x13] = 0xb8322b;
  puVar3[0x14] = 0x5d715b;
  puVar3[0x15] = 0x1a1c7e7;
  puVar3[0x16] = 0xd7890d;
  puVar3[0x17] = 0x1813522;
  puVar3[0x18] = 0x1c9c611;
  puVar3[0x19] = 0x99e4a4;
  puVar3[0x1a] = 0x855234;
  puVar3[0x1b] = 0x17b81c0;
  puVar3[0x1c] = 0xc294bb;
  puVar3[0x1d] = 0x89fae3;
  puVar3[0x1e] = 0x44df5f;
  puVar3[0x1f] = 0x1360159;
  puVar3[0x20] = 0xec31e8;
  puVar3[0x21] = 0x1bcc0f6;
  puVar3[0x22] = 0xa64f8d;
  paVar1->nbits = 0x19;
  puVar4 = (uint32_t *)calloc(0x19,4);
  paVar1->bit_x = puVar4;
  puVar5 = (uint32_t *)calloc(0x19,4);
  paVar1->bit_y = puVar5;
  puVar4[0] = 1;
  puVar4[1] = 2;
  puVar4[2] = 3;
  puVar4[3] = 4;
  puVar5[0] = 1;
  puVar5[1] = 1;
  puVar5[2] = 1;
  puVar5[3] = 1;
  puVar4[4] = 2;
  puVar4[5] = 3;
  puVar4[6] = 5;
  puVar4[7] = 5;
  puVar5[4] = 2;
  puVar5[5] = 2;
  puVar5[6] = 1;
  puVar5[7] = 2;
  puVar4[8] = 5;
  puVar4[9] = 5;
  puVar4[10] = 4;
  puVar4[0xb] = 4;
  puVar5[8] = 3;
  puVar5[9] = 4;
  puVar5[10] = 2;
  puVar5[0xb] = 3;
  puVar4[0xc] = 5;
  puVar4[0xd] = 4;
  puVar4[0xe] = 3;
  puVar4[0xf] = 2;
  puVar5[0xc] = 5;
  puVar5[0xd] = 5;
  puVar5[0xe] = 5;
  puVar5[0xf] = 5;
  puVar4[0x10] = 4;
  puVar4[0x11] = 3;
  puVar4[0x12] = 1;
  puVar4[0x13] = 1;
  puVar5[0x10] = 4;
  puVar5[0x11] = 4;
  puVar5[0x12] = 5;
  puVar5[0x13] = 4;
  puVar4[0x14] = 1;
  puVar4[0x15] = 1;
  puVar4[0x16] = 2;
  puVar4[0x17] = 2;
  puVar5[0x14] = 3;
  puVar5[0x15] = 2;
  puVar5[0x16] = 4;
  puVar5[0x17] = 3;
  puVar4[0x18] = 3;
  puVar5[0x18] = 3;
  paVar1->width_at_border = 7;
  paVar1->total_width = 9;
  return paVar1;
}

Assistant:

apriltag_family_t __attribute__((optimize("O0"))) *tag25h9_create()
{
   apriltag_family_t *tf = calloc(1, sizeof(apriltag_family_t));
   tf->name = strdup("tag25h9");
   tf->h = 9;
   tf->ncodes = 35;
   tf->codes = calloc(35, sizeof(uint64_t));
   tf->codes[0] = 0x000000000156f1f4UL;
   tf->codes[1] = 0x0000000001f28cd5UL;
   tf->codes[2] = 0x00000000016ce32cUL;
   tf->codes[3] = 0x0000000001ea379cUL;
   tf->codes[4] = 0x0000000001390f89UL;
   tf->codes[5] = 0x000000000034fad0UL;
   tf->codes[6] = 0x00000000007dcdb5UL;
   tf->codes[7] = 0x000000000119ba95UL;
   tf->codes[8] = 0x0000000001ae9daaUL;
   tf->codes[9] = 0x0000000000df02aaUL;
   tf->codes[10] = 0x000000000082fc15UL;
   tf->codes[11] = 0x0000000000465123UL;
   tf->codes[12] = 0x0000000000ceee98UL;
   tf->codes[13] = 0x0000000001f17260UL;
   tf->codes[14] = 0x00000000014429cdUL;
   tf->codes[15] = 0x00000000017248a8UL;
   tf->codes[16] = 0x00000000016ad452UL;
   tf->codes[17] = 0x00000000009670adUL;
   tf->codes[18] = 0x00000000016f65b2UL;
   tf->codes[19] = 0x0000000000b8322bUL;
   tf->codes[20] = 0x00000000005d715bUL;
   tf->codes[21] = 0x0000000001a1c7e7UL;
   tf->codes[22] = 0x0000000000d7890dUL;
   tf->codes[23] = 0x0000000001813522UL;
   tf->codes[24] = 0x0000000001c9c611UL;
   tf->codes[25] = 0x000000000099e4a4UL;
   tf->codes[26] = 0x0000000000855234UL;
   tf->codes[27] = 0x00000000017b81c0UL;
   tf->codes[28] = 0x0000000000c294bbUL;
   tf->codes[29] = 0x000000000089fae3UL;
   tf->codes[30] = 0x000000000044df5fUL;
   tf->codes[31] = 0x0000000001360159UL;
   tf->codes[32] = 0x0000000000ec31e8UL;
   tf->codes[33] = 0x0000000001bcc0f6UL;
   tf->codes[34] = 0x0000000000a64f8dUL;
   tf->nbits = 25;
   tf->bit_x = calloc(25, sizeof(uint32_t));
   tf->bit_y = calloc(25, sizeof(uint32_t));
   tf->bit_x[0] = 1;
   tf->bit_y[0] = 1;
   tf->bit_x[1] = 2;
   tf->bit_y[1] = 1;
   tf->bit_x[2] = 3;
   tf->bit_y[2] = 1;
   tf->bit_x[3] = 4;
   tf->bit_y[3] = 1;
   tf->bit_x[4] = 2;
   tf->bit_y[4] = 2;
   tf->bit_x[5] = 3;
   tf->bit_y[5] = 2;
   tf->bit_x[6] = 5;
   tf->bit_y[6] = 1;
   tf->bit_x[7] = 5;
   tf->bit_y[7] = 2;
   tf->bit_x[8] = 5;
   tf->bit_y[8] = 3;
   tf->bit_x[9] = 5;
   tf->bit_y[9] = 4;
   tf->bit_x[10] = 4;
   tf->bit_y[10] = 2;
   tf->bit_x[11] = 4;
   tf->bit_y[11] = 3;
   tf->bit_x[12] = 5;
   tf->bit_y[12] = 5;
   tf->bit_x[13] = 4;
   tf->bit_y[13] = 5;
   tf->bit_x[14] = 3;
   tf->bit_y[14] = 5;
   tf->bit_x[15] = 2;
   tf->bit_y[15] = 5;
   tf->bit_x[16] = 4;
   tf->bit_y[16] = 4;
   tf->bit_x[17] = 3;
   tf->bit_y[17] = 4;
   tf->bit_x[18] = 1;
   tf->bit_y[18] = 5;
   tf->bit_x[19] = 1;
   tf->bit_y[19] = 4;
   tf->bit_x[20] = 1;
   tf->bit_y[20] = 3;
   tf->bit_x[21] = 1;
   tf->bit_y[21] = 2;
   tf->bit_x[22] = 2;
   tf->bit_y[22] = 4;
   tf->bit_x[23] = 2;
   tf->bit_y[23] = 3;
   tf->bit_x[24] = 3;
   tf->bit_y[24] = 3;
   tf->width_at_border = 7;
   tf->total_width = 9;
   tf->reversed_border = false;
   return tf;
}